

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info_test_helper.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::testing::TypeInfoTestHelper::ResetTypeInfo
          (TypeInfoTestHelper *this,
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *descriptors)

{
  DescriptorPool *pool;
  long *plVar1;
  LogMessage *pLVar2;
  pointer ppDVar3;
  TypeResolver *pTVar4;
  TypeInfo *pTVar5;
  pointer ppDVar6;
  ulong uVar7;
  int *local_70 [2];
  int local_60 [11];
  LogFinisher local_31;
  
  if (*(int *)this == 0) {
    ppDVar3 = (descriptors->
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppDVar6 = (descriptors->
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pool = *(DescriptorPool **)(*(long *)(*ppDVar3 + 0x10) + 0x10);
    if (8 < (ulong)((long)ppDVar6 - (long)ppDVar3)) {
      uVar7 = 1;
      do {
        if (pool != *(DescriptorPool **)(*(long *)(ppDVar3[uVar7] + 0x10) + 0x10)) {
          protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
                     ,0x3c);
          pLVar2 = protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_70,
                              "CHECK failed: pool == descriptors[i]->file()->pool(): ");
          pLVar2 = protobuf::internal::LogMessage::operator<<
                             (pLVar2,"Descriptors from different pools are not supported.");
          protobuf::internal::LogFinisher::operator=(&local_31,pLVar2);
          protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
          ppDVar3 = (descriptors->
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ppDVar6 = (descriptors->
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)ppDVar6 - (long)ppDVar3 >> 3));
    }
    local_70[0] = &((LogMessage *)local_70)->line_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"type.googleapis.com","");
    pTVar4 = NewTypeResolverForDescriptorPool((string *)local_70,pool);
    plVar1 = *(long **)(this + 0x10);
    *(TypeResolver **)(this + 0x10) = pTVar4;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (local_70[0] != &((LogMessage *)local_70)->line_) {
      operator_delete(local_70[0]);
    }
    pTVar5 = TypeInfo::NewTypeInfo(*(TypeResolver **)(this + 0x10));
    plVar1 = *(long **)(this + 8);
    *(TypeInfo **)(this + 8) = pTVar5;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  else {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
               ,0x45);
    pLVar2 = protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_70,"Can not reach here.");
    protobuf::internal::LogFinisher::operator=(&local_31,pLVar2);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
  }
  return;
}

Assistant:

void TypeInfoTestHelper::ResetTypeInfo(
    const std::vector<const Descriptor*>& descriptors) {
  switch (type_) {
    case USE_TYPE_RESOLVER: {
      const DescriptorPool* pool = descriptors[0]->file()->pool();
      for (int i = 1; i < descriptors.size(); ++i) {
        GOOGLE_CHECK(pool == descriptors[i]->file()->pool())
            << "Descriptors from different pools are not supported.";
      }
      type_resolver_.reset(
          NewTypeResolverForDescriptorPool(kTypeServiceBaseUrl, pool));
      typeinfo_.reset(TypeInfo::NewTypeInfo(type_resolver_.get()));
      return;
    }
  }
  GOOGLE_LOG(FATAL) << "Can not reach here.";
}